

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  cmComputeLinkInformation *this_01;
  string *psVar3;
  ostream *poVar4;
  cmGlobalGenerator *pcVar5;
  iterator iVar6;
  pointer pbVar7;
  string *i;
  pointer pbVar8;
  int darwin_major_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  string runpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  string installNameTool;
  string darwin_major_version_s;
  istringstream ss;
  byte abStack_308 [352];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runpaths;
  
  if (this->ImportLibrary == false) {
    bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
    if (bVar1) {
      this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        this_00 = this->Target->Target->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&runpaths);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&runpaths);
          psVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&ss);
          std::__cxx11::string::string((string *)&installNameTool,(string *)psVar3);
          std::__cxx11::string::~string((string *)&ss);
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmComputeLinkInformation::GetRPath(this_01,&oldRuntimeDirs,false);
          cmComputeLinkInformation::GetRPath(this_01,&newRuntimeDirs,true);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"DARWIN_MAJOR_VERSION",(allocator<char> *)&runpaths);
          psVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&ss);
          std::__cxx11::string::string((string *)&darwin_major_version_s,(string *)psVar3);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&ss,(string *)&darwin_major_version_s,_S_in);
          std::istream::operator>>((istream *)&ss,&darwin_major_version);
          pbVar8 = oldRuntimeDirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((((abStack_308[*(long *)(_ss + -0x18)] & 5) == 0) && (darwin_major_version < 10)) &&
             ((oldRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               oldRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ||
              (pbVar8 = oldRuntimeDirs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              newRuntimeDirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              newRuntimeDirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&runpaths);
            poVar4 = std::operator<<((ostream *)&runpaths,"WARNING: Target \"");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            poVar4 = std::operator<<(poVar4,(string *)psVar3);
            poVar4 = std::operator<<(poVar4,
                                     "\" has runtime paths which cannot be changed during install.  "
                                    );
            poVar4 = std::operator<<(poVar4,
                                     "To change runtime paths, OS X version 10.6 or newer is required.  "
                                    );
            poVar4 = std::operator<<(poVar4,
                                     "Therefore, runtime paths will not be changed when installing.  "
                                    );
            std::operator<<(poVar4,
                            "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation."
                           );
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this_00,WARNING,&runpath);
            std::__cxx11::string::~string((string *)&runpath);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&runpaths);
          }
          else {
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &runpaths._M_t._M_impl.super__Rb_tree_header._M_header;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            for (pbVar7 = oldRuntimeDirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar8;
                pbVar7 = pbVar7 + 1) {
              pcVar5 = cmMakefile::GetGlobalGenerator(this_00);
              (*pcVar5->_vptr_cmGlobalGenerator[0x14])(&runpath,pcVar5,pbVar7,config);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&runpaths._M_t,&runpath);
              if ((_Rb_tree_header *)iVar6._M_node == &runpaths._M_t._M_impl.super__Rb_tree_header)
              {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&runpaths,&runpath);
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"execute_process(COMMAND ");
                poVar4 = std::operator<<(poVar4,(string *)&installNameTool);
                std::operator<<(poVar4,"\n");
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"  -delete_rpath \"");
                poVar4 = std::operator<<(poVar4,(string *)&runpath);
                std::operator<<(poVar4,"\"\n");
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"  \"");
                poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
                std::operator<<(poVar4,"\")\n");
              }
              std::__cxx11::string::~string((string *)&runpath);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&runpaths._M_t);
            pbVar8 = newRuntimeDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar7 = newRuntimeDirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar8;
                pbVar7 = pbVar7 + 1) {
              pcVar5 = cmMakefile::GetGlobalGenerator(this_00);
              (*pcVar5->_vptr_cmGlobalGenerator[0x14])(&runpath,pcVar5,pbVar7,config);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&runpaths._M_t,&runpath);
              if ((_Rb_tree_header *)iVar6._M_node == &runpaths._M_t._M_impl.super__Rb_tree_header)
              {
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"execute_process(COMMAND ");
                poVar4 = std::operator<<(poVar4,(string *)&installNameTool);
                std::operator<<(poVar4,"\n");
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"  -add_rpath \"");
                poVar4 = std::operator<<(poVar4,(string *)&runpath);
                std::operator<<(poVar4,"\"\n");
                poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar4 = std::operator<<(poVar4,"  \"");
                poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
                std::operator<<(poVar4,"\")\n");
              }
              std::__cxx11::string::~string((string *)&runpath);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&runpaths._M_t);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          std::__cxx11::string::~string((string *)&darwin_major_version_s);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&newRuntimeDirs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&oldRuntimeDirs);
          psVar3 = &installNameTool;
        }
        else {
          cmComputeLinkInformation::GetRPathString_abi_cxx11_((string *)&ss,this_01,false);
          cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)&runpaths,this_01);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&runpaths);
          if (!_Var2) {
            poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
            poVar4 = std::operator<<(poVar4,"file(RPATH_CHANGE\n");
            poVar4 = operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
            poVar4 = std::operator<<(poVar4,"     FILE \"");
            poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
            poVar4 = std::operator<<(poVar4,"\"\n");
            poVar4 = operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
            poVar4 = std::operator<<(poVar4,"     OLD_RPATH \"");
            poVar4 = std::operator<<(poVar4,(string *)&ss);
            poVar4 = std::operator<<(poVar4,"\"\n");
            poVar4 = operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
            poVar4 = std::operator<<(poVar4,"     NEW_RPATH \"");
            poVar4 = std::operator<<(poVar4,(string *)&runpaths);
            std::operator<<(poVar4,"\")\n");
          }
          std::__cxx11::string::~string((string *)&runpaths);
          psVar3 = (string *)&ss;
        }
        std::__cxx11::string::~string((string *)psVar3);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs, newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(MessageType::WARNING, msg.str());
    } else {
      // Note: These paths are kept unique to avoid
      // install_name_tool corruption.
      std::set<std::string> runpaths;
      for (std::string const& i : oldRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          runpaths.insert(runpath);
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -delete_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }

      runpaths.clear();
      for (std::string const& i : newRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -add_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH \"" << oldRpath << "\"\n"
       << indent << "     NEW_RPATH \"" << newRpath << "\")\n";
  }
}